

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdi_XY_14(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  pel *dst1;
  pel *ppVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_t __n;
  int iVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  long local_1c0;
  long local_1b8;
  pel first_line [320];
  
  if (iHeight == 4) {
    lVar7 = (long)i_dst;
    uVar12 = 0;
    uVar13 = (ulong)(uint)iWidth;
    if (iWidth < 1) {
      uVar13 = uVar12;
    }
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      dst[uVar12] = (pel)((uint)pSrc[uVar12 + 1] * 7 +
                          (uint)pSrc[uVar12] + (uint)pSrc[uVar12] * 4 + (uint)pSrc[uVar12 - 1] +
                          (uint)pSrc[uVar12 + 2] + (uint)pSrc[uVar12 + 2] * 2 + 8 >> 4);
      dst[uVar12 + lVar7] =
           (pel)((uint)pSrc[uVar12 + 2] + (uint)pSrc[uVar12 - 1] +
                 ((uint)pSrc[uVar12 + 1] + (uint)pSrc[uVar12]) * 3 + 4 >> 3);
      dst[uVar12 + lVar7 * 2] =
           (pel)((uint)pSrc[uVar12 + 2] +
                 (uint)pSrc[uVar12 + 1] + (uint)pSrc[uVar12 + 1] * 4 +
                 (uint)pSrc[uVar12 - 1] + (uint)pSrc[uVar12 - 1] * 2 + (uint)pSrc[uVar12] * 7 + 8 >>
                4);
      dst[uVar12 + lVar7 * 3] =
           (pel)((uint)pSrc[uVar12 - 1] + (uint)pSrc[uVar12] * 2 + (uint)pSrc[uVar12 + 1] + 2 >> 2);
    }
  }
  else {
    iVar5 = (int)((long)iHeight / 4);
    uVar8 = iVar5 - 1;
    uVar15 = (long)(iVar5 + iWidth + 0xe) & 0xfffffffffffffff0;
    lVar7 = (long)((int)uVar15 * 2);
    lVar10 = (long)((int)uVar15 * 3);
    iVar14 = iHeight + -4;
    uVar13 = 0;
    uVar12 = 0;
    if (0 < (int)uVar8) {
      uVar12 = (ulong)uVar8;
    }
    for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      bVar1 = pSrc[uVar13 * 4 + (2 - (long)iVar14)];
      bVar2 = pSrc[uVar13 * 4 + (3 - (long)iVar14)];
      first_line[uVar13] =
           (pel)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)pSrc[uVar13 * 4 + (4 - (long)iVar14)] >>
                2);
      bVar3 = pSrc[uVar13 * 4 + (1 - (long)iVar14)];
      first_line[uVar13 + uVar15] = (pel)((uint)bVar3 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
      bVar2 = pSrc[uVar13 * 4 - (long)iVar14];
      first_line[uVar13 + lVar7] = (pel)((uint)bVar1 + (uint)bVar3 * 2 + 2 + (uint)bVar2 >> 2);
      first_line[uVar13 + lVar10] =
           (pel)((uint)bVar3 + (uint)bVar2 * 2 + 2 + (uint)pSrc[uVar13 * 4 + (-1 - (long)iVar14)] >>
                2);
    }
    lVar16 = (long)(iVar5 + iWidth + -1);
    for (lVar11 = 0; (long)(uVar12 + lVar11) < lVar16; lVar11 = lVar11 + 1) {
      lVar6 = lVar11 - iVar14;
      bVar1 = pSrc[uVar13 * 4 + lVar6 + -1];
      bVar2 = pSrc[uVar13 * 4 + lVar6];
      bVar3 = pSrc[uVar13 * 4 + lVar6 + 1];
      bVar4 = pSrc[uVar13 * 4 + lVar6 + 2];
      first_line[lVar11 + uVar12] =
           (pel)((uint)bVar2 + (uint)bVar2 * 4 + (uint)bVar1 + (uint)bVar3 * 7 +
                 (uint)bVar4 + (uint)bVar4 * 2 + 8 >> 4);
      first_line[lVar11 + uVar15 + uVar12] =
           (pel)((uint)bVar4 + (uint)bVar1 + ((uint)bVar3 + (uint)bVar2) * 3 + 4 >> 3);
      first_line[lVar11 + lVar7 + uVar12] =
           (pel)((uint)bVar4 +
                 (uint)bVar3 + (uint)bVar3 * 4 + (uint)bVar1 + (uint)bVar1 * 2 + (uint)bVar2 * 7 + 8
                >> 4);
      first_line[lVar11 + uVar12 + lVar10] =
           (pel)((uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
    }
    lVar11 = (long)(int)uVar8;
    __n = (size_t)iWidth;
    uVar13 = 0;
    if (0 < iVar5) {
      uVar13 = (long)iHeight / 4 & 0xffffffff;
    }
    local_1b8 = (lVar10 + lVar16) - __n;
    local_1c0 = (lVar7 + lVar16) - __n;
    lVar7 = (uVar15 + lVar16) - __n;
    while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
      memcpy(dst,first_line + lVar11,__n);
      ppVar9 = dst + i_dst;
      memcpy(ppVar9,first_line + lVar7,__n);
      ppVar9 = ppVar9 + i_dst;
      memcpy(ppVar9,first_line + local_1c0,__n);
      memcpy(ppVar9 + i_dst,first_line + local_1b8,__n);
      local_1b8 = local_1b8 + -1;
      local_1c0 = local_1c0 + -1;
      lVar7 = lVar7 + -1;
      lVar11 = lVar11 + -1;
      dst = ppVar9 + i_dst + i_dst;
    }
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_14(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i;

    if (iHeight != 4) {
        ALIGNED_16(pel first_line[4 * (64 + 16)]);
        int line_size = iWidth + iHeight / 4 - 1;
        int left_size = line_size - iWidth;
        int aligned_line_size = ((line_size + 15) >> 4) << 4;
        pel *pfirst[4] = { first_line, first_line + aligned_line_size, first_line + aligned_line_size * 2, first_line + aligned_line_size * 3 };

        pSrc -= iHeight - 4;
        for (i = 0; i < left_size; i++, pSrc += 4) {
            pfirst[0][i] = (pSrc[2] + pSrc[3] * 2 + pSrc[4] + 2) >> 2;
            pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
            pfirst[2][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
            pfirst[3][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }

        for (; i < line_size; i++, pSrc++) {
            pfirst[0][i] = (pSrc[-1] + pSrc[0] * 5 + pSrc[1] * 7 + pSrc[2] * 3 + 8) >> 4;
            pfirst[1][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
            pfirst[2][i] = (pSrc[-1] * 3 + pSrc[0] * 7 + pSrc[1] * 5 + pSrc[2] + 8) >> 4;
            pfirst[3][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }

        pfirst[0] += left_size;
        pfirst[1] += left_size;
        pfirst[2] += left_size;
        pfirst[3] += left_size;

        iHeight /= 4;

        for (i = 0; i < iHeight; i++) {
            memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[1] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[2] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[3] - i, iWidth * sizeof(pel));
            dst += i_dst;
        }
    }
    else {
        pel *dst1 = dst;
        pel *dst2 = dst1 + i_dst;
        pel *dst3 = dst2 + i_dst;
        pel *dst4 = dst3 + i_dst;

        for (i = 0; i < iWidth; i++, pSrc++) {
            dst1[i] = (pSrc[-1] + pSrc[0] * 5 + pSrc[1] * 7 + pSrc[2] * 3 + 8) >> 4;
            dst2[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
            dst3[i] = (pSrc[-1] * 3 + pSrc[0] * 7 + pSrc[1] * 5 + pSrc[2] + 8) >> 4;
            dst4[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }
    }
}